

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_sample_generated.h
# Opt level: O0

int __thiscall keyfield::sample::Fruit::KeyCompareWithValue(Fruit *this,Apple *_a)

{
  Apple *this_00;
  Color *pCVar1;
  undefined1 auStack_44 [4];
  int color_compare_result;
  Color rhs_a_color;
  uint8_t rhs_a_tag;
  uint8_t lhs_a_tag;
  Apple *rhs_a;
  Apple *lhs_a;
  Apple *_a_local;
  Fruit *this_local;
  
  this_00 = a(this);
  unique0x100000a1 = _a;
  rhs_a_color.rgb_[2]._3_1_ = Apple::tag(this_00);
  rhs_a_color.rgb_[2]._2_1_ = Apple::tag(stack0xffffffffffffffd0);
  if (rhs_a_color.rgb_[2]._3_1_ == rhs_a_color.rgb_[2]._2_1_) {
    pCVar1 = Apple::color(stack0xffffffffffffffd0);
    _auStack_44 = *(undefined8 *)pCVar1->rgb_;
    rhs_a_color.rgb_._0_8_ = *(undefined8 *)(pCVar1->rgb_ + 2);
    this_local._4_4_ = Apple::KeyCompareWithValue(this_00,(Color *)auStack_44);
    if (this_local._4_4_ == 0) {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ =
         (uint)(rhs_a_color.rgb_[2]._2_1_ < rhs_a_color.rgb_[2]._3_1_) -
         (uint)(rhs_a_color.rgb_[2]._3_1_ < rhs_a_color.rgb_[2]._2_1_);
  }
  return this_local._4_4_;
}

Assistant:

int KeyCompareWithValue(const keyfield::sample::Apple &_a) const {
    const auto &lhs_a = a();
    const auto &rhs_a = _a;
    const auto lhs_a_tag = lhs_a.tag();
    const auto rhs_a_tag = rhs_a.tag();
    if (lhs_a_tag != rhs_a_tag)
      return static_cast<int>(lhs_a_tag > rhs_a_tag) - static_cast<int>(lhs_a_tag < rhs_a_tag);
    const auto rhs_a_color = rhs_a.color();
    const auto color_compare_result = lhs_a.KeyCompareWithValue(rhs_a_color);
    if (color_compare_result != 0)
      return color_compare_result;
    return 0;
  }